

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O0

int ready_weapon(obj *wep)

{
  level *lev;
  boolean bVar1;
  char rmno;
  int iVar2;
  int iVar3;
  char *pcVar6;
  char *pcVar7;
  char *oldstr;
  monst *mtmp;
  char *local_170;
  char *local_150;
  monst *this_shkp;
  long dummy;
  char *thestr;
  char *tmp;
  char kbuf [256];
  int res;
  obj *wep_local;
  int iVar4;
  int iVar5;
  
  kbuf[0xfc] = '\0';
  kbuf[0xfd] = '\0';
  kbuf[0xfe] = '\0';
  kbuf[0xff] = '\0';
  if (wep == (obj *)0x0) {
    if (uwep != (obj *)0x0) {
      pcVar6 = body_part(7);
      pline("You are empty %s.",pcVar6);
      setuwep((obj *)0x0);
      return kbuf._252_4_ + 1;
    }
    pcVar6 = body_part(7);
    pline("You are already empty %s.",pcVar6);
    iVar2._0_1_ = kbuf[0xfc];
    iVar2._1_1_ = kbuf[0xfd];
    iVar2._2_1_ = kbuf[0xfe];
    iVar2._3_1_ = kbuf[0xff];
    return iVar2;
  }
  if ((((((uarmg == (obj *)0x0) && (u.uprops[8].extrinsic == 0)) &&
        ((youmonst.mintrinsics & 0x80) == 0)) && (wep->otyp == 0x10e)) &&
      ((((long)wep->corpsenm & 0x3ffffffffffffffU) == 0xc ||
       (((long)wep->corpsenm & 0x3ffffffffffffffU) == 0xb)))) &&
     ((bVar1 = poly_when_stoned(youmonst.data), bVar1 == '\0' ||
      (iVar2 = polymon(0x108), iVar2 == 0)))) {
    pcVar6 = mons_mname(mons + wep->corpsenm);
    pcVar7 = body_part(6);
    pcVar7 = makeplural(pcVar7);
    pline("You wield the %s corpse in your bare %s.",pcVar6,pcVar7);
    pcVar6 = mons_mname(mons + wep->corpsenm);
    pcVar6 = an(pcVar6);
    sprintf((char *)&tmp,"%s corpse",pcVar6);
    bVar1 = delayed_petrify((char *)0x0,(char *)&tmp);
    if (bVar1 == '\0') {
      iVar4._0_1_ = kbuf[0xfc];
      iVar4._1_1_ = kbuf[0xfd];
      iVar4._2_1_ = kbuf[0xfe];
      iVar4._3_1_ = kbuf[0xff];
      return iVar4;
    }
    pcVar6 = mons_mname(mons + wep->corpsenm);
    pline("You release the %s corpse!",pcVar6);
    return kbuf._252_4_ + 1;
  }
  if (((uarms != (obj *)0x0) && ((wep->oclass == '\x02' || (wep->oclass == '\x06')))) &&
     ((*(ushort *)&objects[wep->otyp].field_0x11 & 1) != 0)) {
    if (((wep->oclass == '\x02') && ('\x04' < objects[wep->otyp].oc_subtyp)) &&
       (objects[wep->otyp].oc_subtyp < '\v')) {
      local_150 = "sword";
    }
    else {
      local_150 = "weapon";
      if (wep->otyp == 0x1c) {
        local_150 = "axe";
      }
    }
    pline("You cannot wield a two-handed %s while wearing a shield.",local_150);
    iVar5._0_1_ = kbuf[0xfc];
    iVar5._1_1_ = kbuf[0xfd];
    iVar5._2_1_ = kbuf[0xfe];
    iVar5._3_1_ = kbuf[0xff];
    return iVar5;
  }
  if ((wep->oartifact != '\0') && (iVar2 = touch_artifact(wep,&youmonst), iVar2 == 0)) {
    return kbuf._252_4_ + 1;
  }
  kbuf._252_4_ = kbuf._252_4_ + 1;
  if (((*(uint *)&wep->field_0x4a & 1) == 0) ||
     ((((wep->oclass != '\x02' &&
        ((wep->oclass != '\x06' || (objects[wep->otyp].oc_subtyp == '\0')))) && (wep->otyp != 0x216)
       ) && ((wep->otyp != 0x217 && (wep->otyp != 0xf4)))))) {
    iVar2 = wep->owornmask;
    wep->owornmask = wep->owornmask | 0x100;
    prinv((char *)0x0,wep,0);
    wep->owornmask = iVar2;
    goto LAB_0033b9e9;
  }
  pcVar6 = xname(wep);
  iVar2 = strncmp(pcVar6,"The ",4);
  if (iVar2 == 0) {
LAB_0033b8a6:
    thestr = "";
  }
  else {
    pcVar6 = The(pcVar6);
    iVar2 = strncmp(pcVar6,"The ",4);
    if (iVar2 != 0) goto LAB_0033b8a6;
    thestr = "The ";
  }
  pcVar6 = aobjnam(wep,"weld");
  pcVar7 = "themselves";
  if (wep->quan == 1) {
    pcVar7 = "itself";
  }
  if (((wep->oclass == '\x02') || (wep->oclass == '\x06')) &&
     ((*(ushort *)&objects[wep->otyp].field_0x11 & 1) != 0)) {
    oldstr = body_part(6);
    local_170 = makeplural(oldstr);
  }
  else {
    local_170 = body_part(6);
  }
  pline("%s%s %s to your %s!",thestr,pcVar6,pcVar7,local_170);
  *(uint *)&wep->field_0x4a = *(uint *)&wep->field_0x4a & 0xffffffbf | 0x40;
LAB_0033b9e9:
  setuwep(wep);
  arti_speak(wep);
  bVar1 = artifact_light(wep);
  if (((bVar1 != '\0') && ((*(uint *)&wep->field_0x4a >> 0x13 & 1) == 0)) &&
     ((((begin_burn(level,wep,'\0'), u.uprops[0x1e].intrinsic == 0 &&
        ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
    pcVar6 = Tobjnam(wep,"begin");
    pline("%s to glow brilliantly!",pcVar6);
  }
  lev = level;
  if ((*(uint *)&wep->field_0x4a >> 2 & 1) != 0) {
    rmno = inside_shop(level,u.ux,u.uy);
    mtmp = shop_keeper(lev,rmno);
    if (mtmp != (monst *)0x0) {
      pcVar6 = shkname(mtmp);
      pcVar7 = xname(wep);
      pline("%s says \"You be careful with my %s!\"",pcVar6,pcVar7);
    }
  }
  iVar3._0_1_ = kbuf[0xfc];
  iVar3._1_1_ = kbuf[0xfd];
  iVar3._2_1_ = kbuf[0xfe];
  iVar3._3_1_ = kbuf[0xff];
  return iVar3;
}

Assistant:

static int ready_weapon(struct obj *wep)
{
	/* Separated function so swapping works easily */
	int res = 0;

	if (!wep) {
	    /* No weapon */
	    if (uwep) {
		pline("You are empty %s.", body_part(HANDED));
		setuwep(NULL);
		res++;
	    } else
		pline("You are already empty %s.", body_part(HANDED));
	} else if (!uarmg && !Stone_resistance && wep->otyp == CORPSE &&
		   touch_petrifies(&mons[wep->corpsenm]) &&
		   !(poly_when_stoned(youmonst.data) && polymon(PM_STONE_GOLEM))) {
	    /* Prevent wielding cockatrice when not wearing gloves --KAA */
	    char kbuf[BUFSZ];

	    pline("You wield the %s corpse in your bare %s.",
		mons_mname(&mons[wep->corpsenm]), makeplural(body_part(HAND)));
	    sprintf(kbuf, "%s corpse", an(mons_mname(&mons[wep->corpsenm])));
	    if (delayed_petrify(NULL, kbuf)) {
		pline("You release the %s corpse!", mons_mname(&mons[wep->corpsenm]));
		res++;
	    }
	} else if (uarms && bimanual(wep))
	    pline("You cannot wield a two-handed %s while wearing a shield.",
		is_sword(wep) ? "sword" :
		    wep->otyp == BATTLE_AXE ? "axe" : "weapon");
	else if (wep->oartifact && !touch_artifact(wep, &youmonst)) {
	    res++;	/* takes a turn even though it doesn't get wielded */
	} else {
	    /* Weapon WILL be wielded after this point */
	    res++;
	    if (will_weld(wep)) {
		const char *tmp = xname(wep), *thestr = "The ";
		if (strncmp(tmp, thestr, 4) && !strncmp(The(tmp),thestr,4))
		    tmp = thestr;
		else tmp = "";
		pline("%s%s %s to your %s!", tmp, aobjnam(wep, "weld"),
			(wep->quan == 1L) ? "itself" : "themselves", /* a3 */
			bimanual(wep) ?
				(const char *)makeplural(body_part(HAND))
				: body_part(HAND));
		wep->bknown = TRUE;
	    } else {
		/* The message must be printed before setuwep (since
		 * you might die and be revived from changing weapons),
		 * and the message must be before the death message and
		 * Lifesaved rewielding.  Yet we want the message to
		 * say "weapon in hand", thus this kludge.
		 */
		long dummy = wep->owornmask;
		wep->owornmask |= W_WEP;
		prinv(NULL, wep, 0L);
		wep->owornmask = dummy;
	    }
	    setuwep(wep);

	    /* KMH -- Talking artifacts are finally implemented */
	    arti_speak(wep);

	    if (artifact_light(wep) && !wep->lamplit) {
		begin_burn(level, wep, FALSE);
		if (!Blind)
		    pline("%s to glow brilliantly!", Tobjnam(wep, "begin"));
	    }

	    if (wep->unpaid) {
		struct monst *this_shkp;

		if ((this_shkp = shop_keeper(level, inside_shop(level, u.ux, u.uy))) !=
		    NULL) {
		    pline("%s says \"You be careful with my %s!\"",
			  shkname(this_shkp),
			  xname(wep));
		}
	    }
	}
	return res;
}